

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::CacheCustomExternalWrapperType
          (JavascriptLibrary *this,uintptr_t traceCallback,uintptr_t finalizeCallback,
          uintptr_t interceptors,uintptr_t prototype,DynamicType *dynamicTypeToCache)

{
  WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
  *pWVar1;
  RecyclerWeakReference<Js::DynamicType> *local_60;
  CustomExternalWrapperCallbacks local_58;
  DynamicType *local_38;
  DynamicType *dynamicTypeToCache_local;
  uintptr_t prototype_local;
  uintptr_t interceptors_local;
  uintptr_t finalizeCallback_local;
  uintptr_t traceCallback_local;
  JavascriptLibrary *this_local;
  
  local_38 = dynamicTypeToCache;
  dynamicTypeToCache_local = (DynamicType *)prototype;
  prototype_local = interceptors;
  interceptors_local = finalizeCallback;
  finalizeCallback_local = traceCallback;
  traceCallback_local = (uintptr_t)this;
  pWVar1 = Memory::
           WriteBarrierPtr<JsUtil::WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>_>
           ::operator->(&this->customExternalWrapperTypesCache);
  CustomExternalWrapperCallbacks::CustomExternalWrapperCallbacks
            (&local_58,finalizeCallback_local,interceptors_local,prototype_local,
             (uintptr_t)dynamicTypeToCache_local);
  local_60 = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>(this->recycler,local_38);
  JsUtil::
  BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
  ::Item(&pWVar1->
          super_BaseDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
         ,&local_58,&local_60);
  return;
}

Assistant:

void JavascriptLibrary::CacheCustomExternalWrapperType(uintptr_t traceCallback, uintptr_t finalizeCallback, uintptr_t interceptors, uintptr_t prototype, DynamicType* dynamicTypeToCache)
    {
        customExternalWrapperTypesCache->Item(CustomExternalWrapperCallbacks(traceCallback, finalizeCallback, interceptors, prototype), recycler->CreateWeakReferenceHandle<DynamicType>(dynamicTypeToCache));
    }